

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::
reallocateAndGrow(QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                  *this,GrowthPosition where,qsizetype n,
                 QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                 *old)

{
  Data *pDVar1;
  QArrayData *pQVar2;
  undefined1 *puVar3;
  bool bVar4;
  quintptr qVar5;
  Mapping *pMVar6;
  int iVar7;
  int iVar8;
  pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *ppVar9;
  pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *ppVar10;
  long lVar11;
  long lVar12;
  pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *ppVar13;
  long in_FS_OFFSET;
  QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_> *)
             0x0 && where == GrowsAtEnd) {
    pDVar1 = this->d;
    if (pDVar1 == (Data *)0x0) {
      bVar4 = true;
    }
    else {
      bVar4 = 1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar4)) {
      if (pDVar1 == (Data *)0x0) {
        lVar12 = 0;
        lVar11 = 0;
      }
      else {
        lVar12 = (pDVar1->super_QArrayData).alloc;
        lVar11 = (this->size - (pDVar1->super_QArrayData).alloc) +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
                        ) >> 5);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QtPrivate::
        QMovableArrayOps<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::
        reallocate((QMovableArrayOps<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                    *)this,lVar12 + n + lVar11,Grow);
        return;
      }
      goto LAB_0049b72c;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *)&DAT_aaaaaaaaaaaaaaaa
  ;
  allocateGrow(&local_38,this,n,where);
  if ((n < 1) || (local_38.ptr != (pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *)0x0)
     ) {
    if (this->size != 0) {
      lVar12 = this->size + (n >> 0x3f & n);
      if (this->d == (Data *)0x0) {
        bVar4 = true;
      }
      else {
        bVar4 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      }
      ppVar9 = this->ptr;
      ppVar10 = ppVar9 + lVar12;
      if ((old != (QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                   *)0x0) || (bVar4)) {
        if ((lVar12 != 0) && (0 < lVar12)) {
          ppVar13 = local_38.ptr + local_38.size;
          do {
            iVar7 = (ppVar9->first).r;
            iVar8 = (ppVar9->first).c;
            qVar5 = (ppVar9->first).i;
            pMVar6 = ppVar9->second;
            (ppVar13->first).m.ptr = (ppVar9->first).m.ptr;
            ppVar13->second = pMVar6;
            (ppVar13->first).r = iVar7;
            (ppVar13->first).c = iVar8;
            (ppVar13->first).i = qVar5;
            ppVar9 = ppVar9 + 1;
            local_38.size = local_38.size + 1;
            ppVar13 = ppVar13 + 1;
          } while (ppVar9 < ppVar10);
        }
      }
      else if ((lVar12 != 0) && (0 < lVar12)) {
        ppVar13 = local_38.ptr + local_38.size;
        do {
          iVar7 = (ppVar9->first).r;
          iVar8 = (ppVar9->first).c;
          qVar5 = (ppVar9->first).i;
          pMVar6 = ppVar9->second;
          (ppVar13->first).m.ptr = (ppVar9->first).m.ptr;
          ppVar13->second = pMVar6;
          (ppVar13->first).r = iVar7;
          (ppVar13->first).c = iVar8;
          (ppVar13->first).i = qVar5;
          ppVar9 = ppVar9 + 1;
          local_38.size = local_38.size + 1;
          ppVar13 = ppVar13 + 1;
        } while (ppVar9 < ppVar10);
      }
    }
    pQVar2 = &this->d->super_QArrayData;
    ppVar9 = this->ptr;
    this->d = local_38.d;
    this->ptr = local_38.ptr;
    puVar3 = (undefined1 *)this->size;
    this->size = local_38.size;
    local_38.d = (Data *)pQVar2;
    local_38.ptr = ppVar9;
    local_38.size = (qsizetype)puVar3;
    if (old != (QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                *)0x0) {
      local_38.d = old->d;
      local_38.ptr = old->ptr;
      old->d = (Data *)pQVar2;
      old->ptr = ppVar9;
      local_38.size = old->size;
      old->size = (qsizetype)puVar3;
    }
    if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d)->super_QArrayData,0x20,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    qBadAlloc();
  }
LAB_0049b72c:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }